

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

int JsFgets(char *buf,int size,PAL_FILE *file)

{
  int c;
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = size - 1;
  if ((int)uVar1 < 0) {
    return -1;
  }
  uVar2 = 0;
  bVar3 = false;
  do {
    if (uVar1 == uVar2) {
LAB_001116d7:
      buf[(int)uVar1] = '\0';
      return uVar1;
    }
    c = PAL_getc(file);
    if (c == -1) {
LAB_001116d4:
      uVar1 = (uint)uVar2;
      goto LAB_001116d7;
    }
    buf[uVar2] = (char)c;
    if (c == 10) {
      uVar2 = (ulong)((int)uVar2 + 1);
      goto LAB_001116d4;
    }
    if (bVar3) {
      PAL_ungetc(c,file);
      goto LAB_001116d4;
    }
    bVar3 = c == 0xd;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int JsFgets(char* buf, int size, FILE* file)
{
    int n = size - 1;
    if (n < 0)
        return -1;

    bool crflag = false;
    int c, i = 0;

    for (i = 0; i < n && (c = getc(file)) != EOF; i++) {
        buf[i] = (char)c;
        if (c == '\n') {        // any \n ends a line
            i++;                // keep the \n; we know there is room for \0
            break;
        }
        if (crflag) {           // \r not followed by \n ends line at the \r
            ungetc(c, file);
            break;              // and overwrite c in buf with \0
        }
        crflag = (c == '\r');
    }

    buf[i] = '\0';
    return i;
}